

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

void __thiscall Clasp::ClaspFacade::SolveData::~SolveData(SolveData *this)

{
  ulong uVar1;
  long *plVar2;
  
  reset(this);
  BoundArray::~BoundArray(&this->lower);
  BoundArray::~BoundArray(&this->costs);
  uVar1 = (this->algo).ptr_;
  plVar2 = (long *)(uVar1 & 0xfffffffffffffffe);
  if ((uVar1 & 1) != 0 && plVar2 != (long *)0x0) {
    (this->algo).ptr_ = (uintp)plVar2;
    (**(code **)(*plVar2 + 8))();
  }
  (this->algo).ptr_ = 1;
  uVar1 = (this->en).ptr_;
  plVar2 = (long *)(uVar1 & 0xfffffffffffffffe);
  if ((uVar1 & 1) != 0 && plVar2 != (long *)0x0) {
    (this->en).ptr_ = (uintp)plVar2;
    (**(code **)(*plVar2 + 8))();
  }
  (this->en).ptr_ = 1;
  return;
}

Assistant:

~SolveData() { reset(); }